

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  _Bool cpu_fine_clip)

{
  float fVar1;
  float fVar2;
  char cVar3;
  uint uVar4;
  ImDrawIdx *pIVar5;
  ImDrawVert *pIVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  char *pcVar10;
  ImFontGlyph *pIVar11;
  ImDrawCmd *pIVar12;
  int iVar13;
  char *pcVar14;
  char *in_text;
  ImDrawIdx IVar15;
  char *text_end_00;
  wchar_t wVar16;
  float scale;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float local_9c;
  float local_88;
  uint c;
  ulong local_60;
  ImDrawIdx *local_58;
  ImDrawVert *local_50;
  uint local_44;
  wchar_t local_40;
  int local_3c;
  char *local_38;
  
  if (text_end == (char *)0x0) {
    sVar8 = strlen(text_begin);
    text_end = text_begin + sVar8;
  }
  fVar20 = (float)(int)pos.y;
  fVar17 = clip_rect->w;
  if (fVar20 <= fVar17) {
    scale = size / this->FontSize;
    fVar18 = this->FontSize * scale;
    if ((wrap_width <= 0.0) && (fVar21 = clip_rect->y, fVar20 + fVar18 < fVar21)) {
      while ((fVar19 = fVar18 + fVar20, fVar19 < fVar21 && (text_begin < text_end))) {
        pvVar9 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar9 + 1);
        fVar20 = fVar19;
        if (pvVar9 == (void *)0x0) {
          text_begin = text_end;
        }
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar10 = text_begin, fVar21 = fVar20, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar10, fVar21 < fVar17 && (pcVar10 < text_end))) {
        pvVar9 = memchr(pcVar10,10,(long)text_end - (long)pcVar10);
        pcVar10 = (char *)((long)pvVar9 + 1);
        if (pvVar9 == (void *)0x0) {
          pcVar10 = text_end;
        }
        fVar21 = fVar21 + fVar18;
      }
    }
    if (text_begin != text_end_00) {
      local_88 = pos.x;
      fVar19 = (float)(int)local_88;
      iVar13 = (int)text_end_00 - (int)text_begin;
      local_3c = iVar13 * 6;
      local_40 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_3c,iVar13 * 4);
      local_50 = draw_list->_VtxWritePtr;
      local_58 = draw_list->_IdxWritePtr;
      local_60 = (ulong)draw_list->_VtxCurrentIdx;
      local_44 = col | 0xffffff;
      local_38 = (char *)0x0;
      pcVar10 = local_38;
      fVar17 = fVar19;
      local_9c = fVar19;
      fVar21 = fVar20;
      pcVar14 = text_begin;
LAB_001b101e:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar14;
        fVar1 = fVar21;
        fVar27 = local_9c;
        pcVar7 = local_38;
        if (0.0 < wrap_width) {
          if (pcVar10 == (char *)0x0) {
            pcVar10 = CalcWordWrapPositionA
                                (this,scale,text_begin,text_end_00,(fVar19 - fVar17) + wrap_width);
            pcVar10 = pcVar10 + (pcVar10 == text_begin);
          }
          in_text = text_begin;
          fVar1 = fVar20;
          fVar27 = fVar17;
          pcVar7 = pcVar10;
          if (pcVar10 <= text_begin) {
            fVar20 = fVar20 + fVar18;
            do {
              pcVar10 = text_begin;
              text_begin = pcVar10;
              if (text_end_00 <= pcVar10) goto LAB_001b10c5;
              cVar3 = *pcVar10;
              text_begin = pcVar10 + 1;
            } while ((cVar3 == '\t') || (cVar3 == ' '));
            text_begin = pcVar10 + 1;
            if (cVar3 != '\n') {
              text_begin = pcVar10;
            }
LAB_001b10c5:
            pcVar10 = (char *)0x0;
            fVar17 = fVar19;
            goto LAB_001b101e;
          }
        }
        local_38 = pcVar7;
        local_9c = fVar27;
        fVar20 = fVar1;
        c = (uint)*in_text;
        if (*in_text < '\0') {
          iVar13 = ImTextCharFromUtf8(&c,in_text,text_end_00);
          if (c == 0) break;
          text_begin = in_text + iVar13;
        }
        else {
          text_begin = in_text + 1;
        }
        fVar17 = local_9c;
        fVar21 = fVar20;
        pcVar14 = text_begin;
        if (0x1f < c) {
LAB_001b115b:
          pIVar11 = FindGlyph(this,(ImWchar)c);
          pcVar10 = local_38;
          if (pIVar11 != (ImFontGlyph *)0x0) {
            fVar17 = pIVar11->AdvanceX * scale;
            if (((undefined1  [40])*pIVar11 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
              fVar27 = pIVar11->X0 * scale + local_9c;
              fVar1 = clip_rect->z;
              if (fVar27 <= fVar1) {
                fVar28 = pIVar11->X1 * scale + local_9c;
                fVar2 = clip_rect->x;
                if (fVar2 <= fVar28) {
                  fVar29 = pIVar11->Y0 * scale + fVar20;
                  fVar24 = pIVar11->Y1 * scale + fVar20;
                  fVar22 = pIVar11->U0;
                  fVar26 = pIVar11->V0;
                  fVar25 = pIVar11->U1;
                  fVar23 = pIVar11->V1;
                  if (cpu_fine_clip) {
                    if (fVar27 < fVar2) {
                      fVar22 = fVar22 + (fVar25 - fVar22) *
                                        (1.0 - (fVar28 - fVar2) / (fVar28 - fVar27));
                      fVar27 = fVar2;
                    }
                    fVar2 = clip_rect->y;
                    if (fVar29 < fVar2) {
                      fVar26 = fVar26 + (fVar23 - fVar26) *
                                        (1.0 - (fVar24 - fVar2) / (fVar24 - fVar29));
                      fVar29 = fVar2;
                    }
                    if (fVar1 < fVar28) {
                      fVar25 = (fVar25 - fVar22) * ((fVar1 - fVar27) / (fVar28 - fVar27)) + fVar22;
                      fVar28 = fVar1;
                    }
                    fVar1 = clip_rect->w;
                    if (fVar1 < fVar24) {
                      fVar23 = (fVar23 - fVar26) * ((fVar1 - fVar29) / (fVar24 - fVar29)) + fVar26;
                      fVar24 = fVar1;
                    }
                    if (fVar24 <= fVar29) {
                      local_9c = local_9c + fVar17;
                      fVar17 = local_9c;
                      goto LAB_001b101e;
                    }
                  }
                  uVar4 = local_44;
                  if (((undefined1  [40])*pIVar11 & (undefined1  [40])0x1) == (undefined1  [40])0x0)
                  {
                    uVar4 = col;
                  }
                  IVar15 = (ImDrawIdx)local_60;
                  *local_58 = IVar15;
                  local_58[1] = IVar15 + 1;
                  local_58[2] = IVar15 + 2;
                  local_58[3] = IVar15;
                  local_58[4] = IVar15 + 2;
                  local_58[5] = IVar15 + 3;
                  (local_50->pos).x = fVar27;
                  (local_50->pos).y = fVar29;
                  local_50->col = uVar4;
                  (local_50->uv).x = fVar22;
                  (local_50->uv).y = fVar26;
                  local_50[1].pos.x = fVar28;
                  local_50[1].pos.y = fVar29;
                  local_50[1].col = uVar4;
                  local_50[1].uv.x = fVar25;
                  local_50[1].uv.y = fVar26;
                  local_50[2].pos.x = fVar28;
                  local_50[2].pos.y = fVar24;
                  local_50[2].col = uVar4;
                  local_50[2].uv.x = fVar25;
                  local_50[2].uv.y = fVar23;
                  local_50[3].pos.x = fVar27;
                  local_50[3].pos.y = fVar24;
                  local_50[3].col = uVar4;
                  local_50[3].uv.x = fVar22;
                  local_50[3].uv.y = fVar23;
                  local_50 = local_50 + 4;
                  local_60 = (ulong)((int)local_60 + 4);
                  local_58 = local_58 + 6;
                }
              }
            }
            local_9c = local_9c + fVar17;
            fVar17 = local_9c;
          }
          goto LAB_001b101e;
        }
        pcVar10 = local_38;
        if (c != 10) {
          if (c != 0xd) goto LAB_001b115b;
          goto LAB_001b101e;
        }
        fVar20 = fVar20 + fVar18;
        fVar17 = fVar19;
        local_9c = fVar19;
        fVar21 = fVar20;
      } while (fVar20 < clip_rect->w || fVar20 == clip_rect->w);
      pIVar6 = local_50;
      pIVar5 = local_58;
      (draw_list->VtxBuffer).Size =
           (int)(((long)local_50 - (long)(draw_list->VtxBuffer).Data) / 0x14);
      wVar16 = (wchar_t)((ulong)((long)local_58 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = wVar16;
      iVar13 = local_40 + local_3c;
      pIVar12 = ImVector<ImDrawCmd>::operator[]
                          (&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + -1);
      pIVar12->ElemCount = pIVar12->ElemCount + (wVar16 - iVar13);
      draw_list->_VtxWritePtr = pIVar6;
      draw_list->_IdxWritePtr = pIVar5;
      draw_list->_VtxCurrentIdx = (uint)local_60;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}